

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

RegexPattern * __thiscall Js::FunctionBody::GetLiteralRegexWithLock(FunctionBody *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  WriteBarrierPtr<UnifiedRegex::RegexPattern> *pWVar5;
  
  uVar3 = GetLiteralRegexCount(this);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19af,"(index < GetLiteralRegexCount())",
                                "index < GetLiteralRegexCount()");
    if (!bVar2) goto LAB_006d4460;
    *puVar4 = 0;
  }
  pWVar5 = FunctionProxy::
           GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)18,Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>*>
                     ((FunctionProxy *)this);
  if (pWVar5 == (WriteBarrierPtr<UnifiedRegex::RegexPattern> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19b0,"(this->GetLiteralRegexesWithLock())",
                                "this->GetLiteralRegexesWithLock()");
    if (!bVar2) {
LAB_006d4460:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pWVar5 = FunctionProxy::
           GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)18,Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>*>
                     ((FunctionProxy *)this);
  return pWVar5[index].ptr;
}

Assistant:

UnifiedRegex::RegexPattern *FunctionBody::GetLiteralRegexWithLock(const uint index)
    {
        Assert(index < GetLiteralRegexCount());
        Assert(this->GetLiteralRegexesWithLock());

        return this->GetLiteralRegexesWithLock()[index];
    }